

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

void __thiscall
ymfm::fm_operator<ymfm::opn_registers_base<true>_>::clock_envelope
          (fm_operator<ymfm::opn_registers_base<true>_> *this,uint32_t env_counter)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint local_38;
  uint32_t increment;
  uint32_t relevant_bits;
  uint32_t rate_shift;
  uint32_t rate;
  uint32_t env_counter_local;
  fm_operator<ymfm::opn_registers_base<true>_> *this_local;
  
  if ((this->m_env_state == EG_ATTACK) && (this->m_env_attenuation == 0)) {
    this->m_env_state = EG_DECAY;
  }
  if ((this->m_env_state == EG_DECAY) &&
     ((this->m_cache).eg_sustain <= (uint)this->m_env_attenuation)) {
    this->m_env_state = EG_SUSTAIN;
  }
  bVar1 = (this->m_cache).eg_rate[this->m_env_state];
  local_38 = (uint)(bVar1 >> 2);
  uVar2 = env_counter << (bVar1 >> 2 & 0x1f);
  uVar3 = bitfield(uVar2,0,0xb);
  if (uVar3 == 0) {
    if (local_38 < 0xc) {
      local_38 = 0xb;
    }
    uVar2 = bitfield(uVar2,local_38,3);
    uVar2 = attenuation_increment((uint)bVar1,uVar2);
    if (this->m_env_state == EG_ATTACK) {
      if (bVar1 < 0x3e) {
        this->m_env_attenuation =
             this->m_env_attenuation + (short)((this->m_env_attenuation ^ 0xffffffff) * uVar2 >> 4);
      }
    }
    else {
      uVar3 = opn_registers_base<true>::op_ssg_eg_enable(this->m_regs,this->m_opoffs);
      if (uVar3 == 0) {
        this->m_env_attenuation = this->m_env_attenuation + (short)uVar2;
      }
      else if (this->m_env_attenuation < 0x200) {
        this->m_env_attenuation = this->m_env_attenuation + (short)(uVar2 << 2);
      }
      if (0x3ff < this->m_env_attenuation) {
        this->m_env_attenuation = 0x3ff;
      }
    }
  }
  return;
}

Assistant:

void fm_operator<RegisterType>::clock_envelope(uint32_t env_counter)
{
	// handle attack->decay transitions
	if (m_env_state == EG_ATTACK && m_env_attenuation == 0)
		m_env_state = EG_DECAY;

	// handle decay->sustain transitions; it is important to do this immediately
	// after the attack->decay transition above in the event that the sustain level
	// is set to 0 (in which case we will skip right to sustain without doing any
	// decay); as an example where this can be heard, check the cymbals sound
	// in channel 0 of shinobi's test mode sound #5
	if (m_env_state == EG_DECAY && m_env_attenuation >= m_cache.eg_sustain)
		m_env_state = EG_SUSTAIN;

	// fetch the appropriate 6-bit rate value from the cache
	uint32_t rate = m_cache.eg_rate[m_env_state];

	// compute the rate shift value; this is the shift needed to
	// apply to the env_counter such that it becomes a 5.11 fixed
	// point number
	uint32_t rate_shift = rate >> 2;
	env_counter <<= rate_shift;

	// see if the fractional part is 0; if not, it's not time to clock
	if (bitfield(env_counter, 0, 11) != 0)
		return;

	// determine the increment based on the non-fractional part of env_counter
	uint32_t relevant_bits = bitfield(env_counter, (rate_shift <= 11) ? 11 : rate_shift, 3);
	uint32_t increment = attenuation_increment(rate, relevant_bits);

	// attack is the only one that increases
	if (m_env_state == EG_ATTACK)
	{
		// glitch means that attack rates of 62/63 don't increment if
		// changed after the initial key on (where they are handled
		// specially); nukeykt confirms this happens on OPM, OPN, OPL/OPLL
		// at least so assuming it is true for everyone
		if (rate < 62)
			m_env_attenuation += (~m_env_attenuation * increment) >> 4;
	}

	// all other cases are similar
	else
	{
		// non-SSG-EG cases just apply the increment
		if (!m_regs.op_ssg_eg_enable(m_opoffs))
			m_env_attenuation += increment;

		// SSG-EG only applies if less than mid-point, and then at 4x
		else if (m_env_attenuation < 0x200)
			m_env_attenuation += 4 * increment;

		// clamp the final attenuation
		if (m_env_attenuation >= 0x400)
			m_env_attenuation = 0x3ff;

		// transition from depress to attack
		if (RegisterType::EG_HAS_DEPRESS && m_env_state == EG_DEPRESS && m_env_attenuation >= 0x200)
			start_attack();

		// transition from release to reverb, should switch at -18dB
		if (RegisterType::EG_HAS_REVERB && m_env_state == EG_RELEASE && m_env_attenuation >= 0xc0)
			m_env_state = EG_REVERB;
	}
}